

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O3

size_t __thiscall
kj::FdInputStream::tryRead(FdInputStream *this,ArrayPtr<unsigned_char> buffer,size_t minBytes)

{
  int code;
  ssize_t sVar1;
  uchar *puVar2;
  uchar *__buf;
  Fault f;
  Fault local_38;
  
  puVar2 = buffer.ptr;
  __buf = puVar2;
  if (0 < (long)minBytes) {
    do {
      do {
        sVar1 = read(this->fd,__buf,(size_t)(puVar2 + (buffer.size_ - (long)__buf)));
        if (-1 < sVar1) {
          if (sVar1 != 0) goto LAB_004a902d;
          goto LAB_004a9035;
        }
        code = kj::_::Debug::getOsErrorNumber(false);
      } while (code == -1);
      if (code != 0) {
        kj::_::Debug::Fault::Fault<int,int&>
                  (&local_38,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
                   ,0x15f,code,"n = miniposix::read(fd, pos, max - pos)","fd",&this->fd);
        kj::_::Debug::Fault::fatal(&local_38);
      }
LAB_004a902d:
      __buf = __buf + sVar1;
    } while (__buf < puVar2 + minBytes);
  }
LAB_004a9035:
  return (long)__buf - (long)puVar2;
}

Assistant:

size_t FdInputStream::tryRead(ArrayPtr<byte> buffer, size_t minBytes) {
  byte* pos = buffer.begin();
  byte* min = pos + minBytes;
  byte* max = buffer.end();

  while (pos < min) {
    miniposix::ssize_t n;
    KJ_SYSCALL(n = miniposix::read(fd, pos, max - pos), fd);
    if (n == 0) {
      break;
    }
    pos += n;
  }

  return pos - buffer.begin();
}